

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,bool negation,char *matcher_name,
                   Strings *param_values)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string result;
  Strings *param_values_local;
  char *matcher_name_local;
  bool negation_local;
  
  result.field_2._8_8_ = param_values;
  ConvertIdentifierNameToWords_abi_cxx11_((string *)local_48,(internal *)matcher_name,matcher_name);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)result.field_2._8_8_);
  if (sVar1 != 0) {
    JoinAsTuple(&local_88,(Strings *)result.field_2._8_8_);
    std::operator+(&local_68," ",&local_88);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (negation) {
    std::operator+(&local_b8,"not (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(__return_storage_ptr__,&local_b8,")");
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ string FormatMatcherDescription(bool negation,
                                           const char* matcher_name,
                                           const Strings& param_values) {
  string result = ConvertIdentifierNameToWords(matcher_name);
  if (param_values.size() >= 1)
    result += " " + JoinAsTuple(param_values);
  return negation ? "not (" + result + ")" : result;
}